

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

void cconv_err_convtv(CTState *cts,CType *d,TValue *o,CTInfo flags)

{
  GCstr *pGVar1;
  ulong uVar2;
  
  pGVar1 = lj_ctype_repr(cts->L,(int)((ulong)((long)d - (long)cts->tab) >> 3) * -0x55555555,
                         (GCstr *)0x0);
  uVar2 = 0xd;
  if (0xfffffffffffffff2 < (ulong)(o->it64 >> 0x2f)) {
    uVar2 = ~(o->it64 >> 0x2f);
  }
  if (flags < 0x100) {
    lj_err_callerv(cts->L,LJ_ERR_FFI_BADCONV,lj_obj_itypename[uVar2],pGVar1 + 1);
  }
  lj_err_argv(cts->L,flags >> 8,LJ_ERR_FFI_BADCONV,lj_obj_itypename[uVar2],pGVar1 + 1);
}

Assistant:

LJ_NORET static void cconv_err_convtv(CTState *cts, CType *d, TValue *o,
				      CTInfo flags)
{
  const char *dst = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, d), NULL));
  const char *src = lj_typename(o);
  if (CCF_GETARG(flags))
    lj_err_argv(cts->L, CCF_GETARG(flags), LJ_ERR_FFI_BADCONV, src, dst);
  else
    lj_err_callerv(cts->L, LJ_ERR_FFI_BADCONV, src, dst);
}